

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O2

function<void_(BaseSocket_*)> * __thiscall
BaseSocket::BindCloseFunction
          (function<void_(BaseSocket_*)> *__return_storage_ptr__,BaseSocket *this,
          function<void_(BaseSocket_*)> *fClosing)

{
  BaseSocketImpl *pBVar1;
  function<void_(BaseSocket_*)> fStack_38;
  
  pBVar1 = (this->Impl_)._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  std::function<void_(BaseSocket_*)>::function(&fStack_38,fClosing);
  (*pBVar1->_vptr_BaseSocketImpl[5])(__return_storage_ptr__,pBVar1,&fStack_38);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(BaseSocket*)> BaseSocket::BindCloseFunction(std::function<void(BaseSocket*)> fClosing)
{
    return GetImpl()->BindCloseFunction(fClosing);
}